

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

void dmrC_insert_select(dmr_C *C,basic_block *bb,instruction *br,instruction *phi_node,
                       pseudo_t if_true,pseudo_t if_false)

{
  instruction_list **head;
  pseudo_t ppVar1;
  anon_union_8_2_14638a90_for_instruction_5 aVar2;
  instruction *ptr;
  undefined8 *puVar3;
  
  head = &bb->insns;
  ptrlist_undo_last((ptr_list **)head);
  ptr = alloc_typed_instruction(C,0x25,phi_node->type);
  ptr->bb = bb;
  ppVar1 = (br->field_5).target;
  if (ppVar1 == (pseudo_t)0x0) {
    __assert_fail("br->cond",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                  ,0x2de,
                  "void dmrC_insert_select(struct dmr_C *, struct basic_block *, struct instruction *, struct instruction *, pseudo_t, pseudo_t)"
                 );
  }
  (ptr->field_6).field_4.phi_src = ppVar1;
  if ((ppVar1->type != PSEUDO_VOID) && (ppVar1->type != PSEUDO_VAL)) {
    puVar3 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
    puVar3[1] = &ptr->field_6;
    *puVar3 = ptr;
    ptrlist_add((ptr_list **)&ppVar1->users,puVar3,&C->ptrlist_allocator);
  }
  aVar2 = phi_node->field_5;
  if (((aVar2.target)->field_5).sym == (symbol *)phi_node) {
    ptr->field_5 = aVar2;
    *(instruction **)((long)aVar2 + 0x20) = ptr;
    (ptr->field_6).field_6.src2 = if_true;
    if (((if_true != (pseudo_t)0x0) && (if_true->type != PSEUDO_VOID)) &&
       (if_true->type != PSEUDO_VAL)) {
      puVar3 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar3[1] = (undefined1 *)((long)&ptr->field_6 + 8);
      *puVar3 = ptr;
      ptrlist_add((ptr_list **)&if_true->users,puVar3,&C->ptrlist_allocator);
    }
    (ptr->field_6).field_6.src3 = if_false;
    if (((if_false != (pseudo_t)0x0) && (if_false->type != PSEUDO_VOID)) &&
       (if_false->type != PSEUDO_VAL)) {
      puVar3 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar3[1] = (undefined1 *)((long)&ptr->field_6 + 0x10);
      *puVar3 = ptr;
      ptrlist_add((ptr_list **)&if_false->users,puVar3,&C->ptrlist_allocator);
    }
    ptrlist_add((ptr_list **)head,ptr,&C->ptrlist_allocator);
    ptrlist_add((ptr_list **)head,br,&C->ptrlist_allocator);
    return;
  }
  __assert_fail("target->def == phi_node",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0x2e2,
                "void dmrC_insert_select(struct dmr_C *, struct basic_block *, struct instruction *, struct instruction *, pseudo_t, pseudo_t)"
               );
}

Assistant:

void dmrC_insert_select(struct dmr_C *C, struct basic_block *bb, struct instruction *br, struct instruction *phi_node, pseudo_t if_true, pseudo_t if_false)
{
	pseudo_t target;
	struct instruction *select;

	/* Remove the 'br' */
	dmrC_delete_last_instruction(&bb->insns);

	select = alloc_typed_instruction(C, OP_SEL, phi_node->type);
	select->bb = bb;

	assert(br->cond);
	dmrC_use_pseudo(C, select, br->cond, &select->src1);

	target = phi_node->target;
	assert(target->def == phi_node);
	select->target = target;
	target->def = select;

	dmrC_use_pseudo(C, select, if_true, &select->src2);
	dmrC_use_pseudo(C, select, if_false, &select->src3);

	dmrC_add_instruction(C, &bb->insns, select);
	dmrC_add_instruction(C, &bb->insns, br);
}